

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::OP_GetElementI(Var instance,Var index,ScriptContext *scriptContext)

{
  bool bVar1;
  uint32 uVar2;
  Var pvVar3;
  double dVar4;
  double dVar5;
  RecyclableObject *local_38;
  RecyclableObject *cacheOwner;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  
  pvVar3 = (Var)BreakSpeculation();
  bVar1 = TaggedInt::Is(index);
  if (bVar1) {
LAB_0099c8ef:
    pvVar3 = GetElementIIntIndex(pvVar3,index,scriptContext);
    return pvVar3;
  }
  if ((ulong)index >> 0x32 == 0) {
    bVar1 = VarIs<Js::RecyclableObject>(pvVar3);
    if ((bVar1) &&
       (bVar1 = GetPropertyRecordUsageCache
                          (index,scriptContext,(PropertyRecordUsageCache **)&cacheOwner,&local_38),
       bVar1)) {
      pvVar3 = GetElementIWithCache<false>
                         (pvVar3,local_38,(PropertyRecordUsageCache *)cacheOwner,scriptContext,
                          (PropertyCacheOperationInfo *)0x0);
      return pvVar3;
    }
  }
  else {
    uVar2 = JavascriptConversion::ToUInt32(index,scriptContext);
    dVar4 = JavascriptNumber::GetValue(index);
    if (-1 < (int)uVar2) {
      dVar5 = (double)uVar2;
      if ((dVar4 == dVar5) && (!NAN(dVar4) && !NAN(dVar5))) {
        index = (Var)((ulong)uVar2 | 0x1000000000000);
        goto LAB_0099c8ef;
      }
    }
  }
  pvVar3 = GetElementIHelper(pvVar3,index,pvVar3,scriptContext);
  return pvVar3;
}

Assistant:

Var JavascriptOperators::OP_GetElementI(Var instance, Var index, ScriptContext* scriptContext)
    {
#ifdef ENABLE_SPECTRE_RUNTIME_MITIGATIONS
        instance = BreakSpeculation(instance);
#endif
        if (TaggedInt::Is(index))
        {
            return GetElementIIntIndex(instance, index, scriptContext);
        }

        if (JavascriptNumber::Is_NoTaggedIntCheck(index))
        {
            uint32 uint32Index = JavascriptConversion::ToUInt32(index, scriptContext);

            if ((double)uint32Index == JavascriptNumber::GetValue(index) && !TaggedInt::IsOverflow(uint32Index))
            {
                index = TaggedInt::ToVarUnchecked(uint32Index);
                return GetElementIIntIndex(instance, index, scriptContext);
            }
        }
        else if (VarIs<RecyclableObject>(instance))
        {
            RecyclableObject* cacheOwner;
            PropertyRecordUsageCache* propertyRecordUsageCache;
            if (GetPropertyRecordUsageCache(index, scriptContext, &propertyRecordUsageCache, &cacheOwner))
            {
                return GetElementIWithCache<false /* ReturnOperationInfo */>(instance, cacheOwner, propertyRecordUsageCache, scriptContext, nullptr);
            }
        }

        return JavascriptOperators::GetElementIHelper(instance, index, instance, scriptContext);
    }